

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.cpp
# Opt level: O2

void __thiscall chatra::Scope::~Scope(Scope *this)

{
  atomic<int> *paVar1;
  Object *this_00;
  long lVar2;
  Reference RVar3;
  ulong uVar4;
  SpinLock *this_01;
  TypeId local_24;
  Reference local_20;
  Reference ref;
  
  if (((this->captured)._M_base._M_i & 1U) != 0) {
    RVar3 = Scope::ref(this,CapturedScope);
    this_00 = (RVar3.node)->object;
    local_20 = Object::ref(this_00,CapturedScope);
    LOCK();
    paVar1 = &(this->
              super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
              ).readCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_24 = CapturedScopeObject;
    Reference::
    allocateWithoutLock<chatra::Object,chatra::TypeId,std::vector<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>,std::allocator<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>>>,std::vector<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>,std::allocator<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>>>,std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&>
              (&local_20,&local_24,&this->groups,&this->nodes,
               (this->
               super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
               ).valueForRead._M_b._M_p);
    LOCK();
    paVar1 = &(this->
              super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
              ).readCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    lVar2 = *(long *)&this_00[1].super_Lockable.lockCount;
    (&this_00[1]._vptr_Object)[lVar2] = (_func_int **)0x0;
    LOCK();
    this_00[1].objectIndex = (size_t)(&this_00[1]._vptr_Object + lVar2);
    UNLOCK();
    do {
    } while (0 < (int)this_00[1].gcGeneration);
    uVar4 = *(ulong *)&this_00[1].super_Lockable.lockCount ^ 1;
    *(ulong *)&this_00[1].super_Lockable.lockCount = uVar4;
    (&this_00[1]._vptr_Object)[uVar4] = (_func_int **)0x0;
  }
  this_01 = &this->storage->lockScopes;
  SpinLock::lock(this_01);
  local_20.node = (ReferenceNode *)this;
  std::
  _Hashtable<chatra::Scope_*,_chatra::Scope_*,_std::allocator<chatra::Scope_*>,_std::__detail::_Identity,_std::equal_to<chatra::Scope_*>,_std::hash<chatra::Scope_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->storage->scopes)._M_h);
  (this_01->flag).super___atomic_flag_base._M_i = false;
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::~vector(&this->nodes);
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::~vector(&this->groups);
  AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
  ::~AsyncRead(&this->
                super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
              );
  return;
}

Assistant:

Scope::~Scope() {
	if (captured) {
		auto& capturedScope = this->ref(StringId::CapturedScope).derefWithoutLock<CapturedScope>();
		auto ref = capturedScope.ref(StringId::CapturedScope);
		read([&](const RefsContainer& refs) {
			ref.allocateWithoutLock<Object>(TypeId::CapturedScopeObject, std::move(groups), std::move(nodes), refs);
		});
		capturedScope.scope.write([](Scope*& scope) { scope = nullptr; });
	}

	{
		std::lock_guard<SpinLock> lock(storage.lockScopes);

		// Checking readCount outside lockScopes would be unsafe
		// because garbage collector may increment readCount asynchronously inside lockScopes
		chatra_assert(getReadCount() == 0);

		storage.scopes.erase(this);
	}
}